

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::maybeAmbiguateTypeReference(Parser *this,TypeReferenceSyntax **tyRef)

{
  SyntaxKind SVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  TypedefNameSyntax *pTVar6;
  TypeNameSyntax *pTVar7;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar8;
  AbstractDeclaratorSyntax *pAVar9;
  TypeNameAsTypeReferenceSyntax *pTVar10;
  AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax *node;
  ostream *poVar11;
  TypedefNameSyntax *tydefName;
  long lVar4;
  
  SVar1 = C::SyntaxNode::kind(&(*tyRef)->super_SyntaxNode);
  if (SVar1 == ExpressionAsTypeReference) {
    iVar2 = (*((*tyRef)->super_SyntaxNode).super_Managed._vptr_Managed[0xcc])();
    SVar1 = C::SyntaxNode::kind(*(SyntaxNode **)(CONCAT44(extraout_var,iVar2) + 0x18));
    if (SVar1 == ParenthesizedExpression) {
      iVar2 = (*((*tyRef)->super_SyntaxNode).super_Managed._vptr_Managed[0xcc])();
      iVar3 = (*(((ExpressionAsTypeReferenceSyntax *)CONCAT44(extraout_var_00,iVar2))->expr_->
                super_SyntaxNode).super_Managed._vptr_Managed[0x76])();
      lVar4 = CONCAT44(extraout_var_01,iVar3);
      lVar5 = (**(code **)(**(long **)(lVar4 + 0x30) + 0x410))();
      if (lVar5 != 0) {
        pTVar6 = makeNode<psy::C::TypedefNameSyntax>(this);
        tydefName = pTVar6;
        lVar5 = (**(code **)(**(long **)(lVar4 + 0x30) + 0x410))();
        pTVar6->identTkIdx_ = *(IndexType *)(lVar5 + 0x28);
        pTVar7 = makeNode<psy::C::TypeNameSyntax>(this);
        pSVar8 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::TypedefNameSyntax*&>
                           (this,&tydefName);
        pTVar7->specs_ = pSVar8;
        pAVar9 = makeNode<psy::C::AbstractDeclaratorSyntax>(this);
        pTVar7->decltor_ = &pAVar9->super_DeclaratorSyntax;
        pTVar10 = makeNode<psy::C::TypeNameAsTypeReferenceSyntax>(this);
        pTVar10->openParenTkIdx_ = *(IndexType *)(lVar4 + 0x28);
        pTVar10->typeName_ = pTVar7;
        pTVar10->closeParenTkIdx_ = *(IndexType *)(lVar4 + 0x38);
        node = makeNode<psy::C::AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax>(this);
        *tyRef = &node->super_TypeReferenceSyntax;
        node->exprAsTyRef_ = (ExpressionAsTypeReferenceSyntax *)CONCAT44(extraout_var_00,iVar2);
        node->tyNameAsTyRef_ = pTVar10;
        DiagnosticsReporter::AmbiguousTypeNameOrExpressionAsTypeReference(&this->diagReporter_,node)
        ;
      }
      return;
    }
  }
  poVar11 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar11 = std::operator<<(poVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Common.cpp"
                           );
  poVar11 = std::operator<<(poVar11,":");
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,100);
  poVar11 = std::operator<<(poVar11," ");
  poVar11 = std::operator<<(poVar11,"");
  std::endl<char,std::char_traits<char>>(poVar11);
  return;
}

Assistant:

void Parser::maybeAmbiguateTypeReference(TypeReferenceSyntax*& tyRef)
{
    PSY_ASSERT_3(tyRef->kind() == SyntaxKind::ExpressionAsTypeReference
                    && (tyRef->asExpressionAsTypeReference()->expr_->kind()
                            == SyntaxKind::ParenthesizedExpression),
                  return, "");

    auto exprAsTyRef = tyRef->asExpressionAsTypeReference();
    auto parenExpr = exprAsTyRef->expr_->asParenthesizedExpression();
    if (!parenExpr->expr_->asIdentifierName())
        return;

    auto tydefName = makeNode<TypedefNameSyntax>();
    tydefName->identTkIdx_ = parenExpr->expr_->asIdentifierName()->identTkIdx_;
    auto tyName = makeNode<TypeNameSyntax>();
    tyName->specs_ =  makeNode<SpecifierListSyntax>(tydefName);
    tyName->decltor_ = makeNode<AbstractDeclaratorSyntax>();
    auto tyNameAsTyRef = makeNode<TypeNameAsTypeReferenceSyntax>();
    tyNameAsTyRef->openParenTkIdx_ = parenExpr->openParenTkIdx_;
    tyNameAsTyRef->typeName_ = tyName;
    tyNameAsTyRef->closeParenTkIdx_ = parenExpr->closeParenTkIdx_;

    auto ambigTyRef = makeNode<AmbiguousTypeNameOrExpressionAsTypeReferenceSyntax>();
    tyRef = ambigTyRef;
    ambigTyRef->exprAsTyRef_ = exprAsTyRef;
    ambigTyRef->tyNameAsTyRef_ = tyNameAsTyRef;

    diagReporter_.AmbiguousTypeNameOrExpressionAsTypeReference(ambigTyRef);
}